

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eln.c
# Opt level: O2

LineInfo * el_line(EditLine *el)

{
  byte *pbVar1;
  el_zfunc_t p_Var2;
  LineInfoW *pLVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  wchar_t *pwVar7;
  
  pLVar3 = el_wline(el);
  if (((uint)el->el_flags >> 9 & 1) == 0) {
    el->el_flags = el->el_flags | 0x200;
    pcVar4 = ct_encode_string(pLVar3->buffer,&el->el_lgcyconv);
    (el->el_lgcylinfo).buffer = pcVar4;
    lVar6 = 0;
    for (pwVar7 = pLVar3->buffer; pwVar7 < pLVar3->cursor; pwVar7 = pwVar7 + 1) {
      sVar5 = ct_enc_width(*pwVar7);
      lVar6 = lVar6 + sVar5;
    }
    (el->el_lgcylinfo).cursor = (el->el_lgcylinfo).buffer + lVar6;
    lVar6 = 0;
    for (pwVar7 = pLVar3->buffer; pwVar7 < pLVar3->lastchar; pwVar7 = pwVar7 + 1) {
      sVar5 = ct_enc_width(*pwVar7);
      lVar6 = lVar6 + sVar5;
    }
    (el->el_lgcylinfo).lastchar = (el->el_lgcylinfo).buffer + lVar6;
    p_Var2 = (el->el_chared).c_resizefun;
    if (p_Var2 != (el_zfunc_t)0x0) {
      (*p_Var2)(el,(el->el_chared).c_resizearg);
    }
    pbVar1 = (byte *)((long)&el->el_flags + 1);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  return &el->el_lgcylinfo;
}

Assistant:

const LineInfo *
el_line(EditLine *el)
{
	const LineInfoW *winfo = el_wline(el);
	LineInfo *info = &el->el_lgcylinfo;
	size_t offset;
	const wchar_t *p;

	if (el->el_flags & FROM_ELLINE)
		return info;

	el->el_flags |= FROM_ELLINE;
	info->buffer   = ct_encode_string(winfo->buffer, &el->el_lgcyconv);

	offset = 0;
	for (p = winfo->buffer; p < winfo->cursor; p++)
		offset += ct_enc_width(*p);
	info->cursor = info->buffer + offset;

	offset = 0;
	for (p = winfo->buffer; p < winfo->lastchar; p++)
		offset += ct_enc_width(*p);
	info->lastchar = info->buffer + offset;

	if (el->el_chared.c_resizefun)  
		(*el->el_chared.c_resizefun)(el, el->el_chared.c_resizearg);
	el->el_flags &= ~FROM_ELLINE;

	return info;
}